

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ParseSubjectKeyIdentifier(bssl *this,Input extension_value,Input *subject_key_identifier)

{
  Input input;
  bool bVar1;
  undefined1 local_40 [8];
  Parser extension_value_parser;
  Input *subject_key_identifier_local;
  Input extension_value_local;
  
  extension_value_parser.advance_len_ = extension_value.data_.size_;
  input.data_.size_ = (size_t)extension_value.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_40,input);
  bVar1 = der::Parser::ReadTag((Parser *)local_40,4,(Input *)extension_value_parser.advance_len_);
  if (bVar1) {
    bVar1 = der::Parser::HasMore((Parser *)local_40);
    if (bVar1) {
      extension_value_local.data_.size_._7_1_ = false;
    }
    else {
      extension_value_local.data_.size_._7_1_ = true;
    }
  }
  else {
    extension_value_local.data_.size_._7_1_ = false;
  }
  return extension_value_local.data_.size_._7_1_;
}

Assistant:

bool ParseSubjectKeyIdentifier(der::Input extension_value,
                               der::Input *subject_key_identifier) {
  //    SubjectKeyIdentifier ::= KeyIdentifier
  //
  //    KeyIdentifier ::= OCTET STRING
  der::Parser extension_value_parser(extension_value);
  if (!extension_value_parser.ReadTag(CBS_ASN1_OCTETSTRING,
                                      subject_key_identifier)) {
    return false;
  }

  // There shouldn't be any unconsumed data in the extension SEQUENCE.
  if (extension_value_parser.HasMore()) {
    return false;
  }

  return true;
}